

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O3

void container_checked_add(container_t *container,uint16_t val,uint8_t typecode)

{
  ushort uVar1;
  uint uVar2;
  array_container_t *container_00;
  uint64_t *puVar3;
  uint16_t *puVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  unsigned_long b;
  ulong uVar7;
  int iVar8;
  uint8_t local_39;
  ulong local_38;
  
  container_00 = (array_container_t *)container;
  local_39 = typecode;
  if ((int)CONCAT71(in_register_00000011,typecode) == 4) {
    container_00 = (array_container_t *)
                   shared_container_extract_copy((shared_container_t *)container,&local_39);
  }
  if (local_39 == '\x03') {
    run_container_add((run_container_t *)container_00,val);
    b = 3;
    goto LAB_00102d87;
  }
  if (local_39 == '\x02') {
    iVar8 = container_00->cardinality;
    if (((long)iVar8 == 0) ||
       ((puVar4 = container_00->array, iVar8 < 0x1000 && (puVar4[(long)iVar8 + -1] < val)))) {
      if (iVar8 == container_00->capacity) {
        array_container_grow(container_00,iVar8 + 1,true);
        iVar8 = container_00->cardinality;
      }
      container_00->cardinality = iVar8 + 1;
      container_00->array[iVar8] = val;
    }
    else {
      if (iVar8 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar8 + -1;
        uVar6 = 0;
        do {
          uVar2 = iVar5 + uVar6 >> 1;
          uVar1 = *(ushort *)((long)puVar4 + (ulong)(iVar5 + uVar6 & 0xfffffffe));
          if (uVar1 < val) {
            uVar6 = uVar2 + 1;
          }
          else {
            if (uVar1 <= val) goto LAB_00102d82;
            iVar5 = uVar2 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        if (0xfff < iVar8) {
          container_00 = (array_container_t *)bitset_container_from_array(container_00);
          puVar3 = (uint64_t *)container_00->array;
          goto LAB_00102cb8;
        }
      }
      if (iVar8 == container_00->capacity) {
        array_container_grow(container_00,iVar8 + 1,true);
        puVar4 = container_00->array;
      }
      local_38 = (ulong)uVar6;
      memmove(puVar4 + local_38 + 1,puVar4 + local_38,(long)(int)(iVar8 - uVar6) * 2);
      container_00->array[local_38] = val;
      container_00->cardinality = container_00->cardinality + 1;
    }
LAB_00102d82:
    b = 2;
  }
  else {
    puVar3 = (uint64_t *)container_00->array;
LAB_00102cb8:
    uVar7 = puVar3[val >> 6] | 1L << ((ulong)val & 0x3f);
    container_00->cardinality =
         container_00->cardinality + (int)((puVar3[val >> 6] ^ uVar7) >> ((byte)val & 0x3f));
    puVar3[val >> 6] = uVar7;
    b = 1;
  }
LAB_00102d87:
  _assert_int_equal((ulong)typecode,b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                    ,0x1d);
  _assert_true((ulong)(container_00 == (array_container_t *)container),"container == new_container",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x1e);
  return;
}

Assistant:

static inline void container_checked_add(container_t *container, uint16_t val,
                                         uint8_t typecode) {
    uint8_t new_type;
    container_t *new_container =
        container_add(container, val, typecode, &new_type);
    assert_int_equal(typecode, new_type);
    assert_true(container == new_container);
}